

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_fcaddh_aarch64(void *vd,void *vn,void *vm,void *vfpst,uint32_t desc)

{
  ushort uVar1;
  float16 fVar2;
  float16 fVar3;
  uint32_t uVar4;
  ulong opr_sz_00;
  uintptr_t max_sz;
  float16 e3;
  float16 e2;
  float16 e1;
  float16 e0;
  uintptr_t i;
  uint32_t neg_imag;
  uint32_t neg_real;
  float_status *fpst;
  float16 *m;
  float16 *n;
  float16 *d;
  uintptr_t opr_sz;
  uint32_t desc_local;
  void *vfpst_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  uVar4 = extract32(desc,10,1);
  for (_e3 = 0; _e3 < opr_sz_00 >> 1; _e3 = _e3 + 2) {
    fVar3 = *(float16 *)((long)vn + _e3 * 2 + 2);
    uVar1 = *(ushort *)((long)vm + _e3 * 2);
    fVar2 = float16_add_aarch64(*(float16 *)((long)vn + _e3 * 2),
                                *(ushort *)((long)vm + _e3 * 2 + 2) ^ (ushort)((uVar4 ^ 1) << 0xf),
                                (float_status *)vfpst);
    *(float16 *)((long)vd + _e3 * 2) = fVar2;
    fVar3 = float16_add_aarch64(fVar3,uVar1 ^ (ushort)(uVar4 << 0xf),(float_status *)vfpst);
    *(float16 *)((long)vd + _e3 * 2 + 2) = fVar3;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_fcaddh)(void *vd, void *vn, void *vm,
                         void *vfpst, uint32_t desc)
{
    uintptr_t opr_sz = simd_oprsz(desc);
    float16 *d = vd;
    float16 *n = vn;
    float16 *m = vm;
    float_status *fpst = vfpst;
    uint32_t neg_real = extract32(desc, SIMD_DATA_SHIFT, 1);
    uint32_t neg_imag = neg_real ^ 1;
    uintptr_t i;

    /* Shift boolean to the sign bit so we can xor to negate.  */
    neg_real <<= 15;
    neg_imag <<= 15;

    for (i = 0; i < opr_sz / 2; i += 2) {
        float16 e0 = n[H2(i)];
        float16 e1 = m[H2(i + 1)] ^ neg_imag;
        float16 e2 = n[H2(i + 1)];
        float16 e3 = m[H2(i)] ^ neg_real;

        d[H2(i)] = float16_add(e0, e1, fpst);
        d[H2(i + 1)] = float16_add(e2, e3, fpst);
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}